

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunkedAllocator.c
# Opt level: O0

void * sysbvm_chunkedAllocator_allocate
                 (sysbvm_chunkedAllocator_t *allocator,size_t size,size_t alignment)

{
  sysbvm_chunkedAllocatorChunk_t *psVar1;
  size_t sVar2;
  uint8_t *result;
  size_t alignedOffset;
  sysbvm_chunkedAllocatorChunk_t *chunk;
  size_t alignment_local;
  size_t size_local;
  sysbvm_chunkedAllocator_t *allocator_local;
  
  psVar1 = sysbvm_chunkedAllocator_ensureChunkWithRequiredCapacity(allocator,size,alignment);
  if (psVar1 == (sysbvm_chunkedAllocatorChunk_t *)0x0) {
    sysbvm_error_assertionFailure
              (
              "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/lib/sysbvm/chunkedAllocator.c:111: assertion failure: chunk"
              );
  }
  sVar2 = sysbvm_chunkedAllocator_sizeAlignedTo(psVar1->size,alignment);
  psVar1->size = sVar2 + size;
  if (psVar1->capacity < psVar1->size) {
    sysbvm_error_assertionFailure
              (
              "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/lib/sysbvm/chunkedAllocator.c:116: assertion failure: chunk->size <= chunk->capacity"
              );
  }
  return (void *)((long)&psVar1[1].previous + sVar2);
}

Assistant:

SYSBVM_API void* sysbvm_chunkedAllocator_allocate(sysbvm_chunkedAllocator_t *allocator, size_t size, size_t alignment)
{
    sysbvm_chunkedAllocatorChunk_t *chunk = sysbvm_chunkedAllocator_ensureChunkWithRequiredCapacity(allocator, size, alignment);
    SYSBVM_ASSERT(chunk);

    size_t alignedOffset = sysbvm_chunkedAllocator_sizeAlignedTo(chunk->size, alignment);
    uint8_t *result = (uint8_t*)(chunk + 1) + alignedOffset;
    chunk->size = alignedOffset + size;
    SYSBVM_ASSERT(chunk->size <= chunk->capacity);

    return result;
}